

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

void __thiscall
StreamReplacer::registerStream
          (StreamReplacer *this,QPDFObjectHandle *stream,
          shared_ptr<QPDFObjectHandle::StreamDataProvider> *self)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
  __l;
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  reference pbVar5;
  mapped_type *pmVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *local_300;
  allocator<char> local_279;
  string local_278 [32];
  undefined1 local_258 [8];
  QPDFObjectHandle protect;
  string local_240 [32];
  QPDFObjectHandle local_220;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_210;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
  local_1fa;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1f9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  local_1f0;
  iterator local_1c0;
  size_type local_1b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_1b0;
  undefined1 local_180 [8];
  QPDFObjectHandle decode_parms;
  QPDFObjectHandle dp_stream;
  string local_158 [8];
  string p_str;
  undefined1 local_130 [7];
  char p [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  QPDFObjectHandle dict;
  exception *e;
  undefined1 local_58 [8];
  QPDFObjectHandle dict_updates;
  bool should_replace;
  QPDFObjectHandle local_38;
  QPDFObjGen local_28;
  QPDFObjGen og;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> *self_local;
  QPDFObjectHandle *stream_local;
  StreamReplacer *this_local;
  
  og = (QPDFObjGen)self;
  local_28 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  sVar3 = std::
          map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
          ::count(&this->copied_streams,&local_28);
  if (sVar3 == 0) {
    QPDFObjectHandle::newNull();
    pmVar4 = std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[](&this->copied_streams,&local_28);
    QPDFObjectHandle::operator=(pmVar4,&local_38);
    QPDFObjectHandle::~QPDFObjectHandle(&local_38);
    dict_updates.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    QPDFObjectHandle::newDictionary();
    dict_updates.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ =
         maybeReplace(this,local_28,stream,(Pipeline *)0x0,(QPDFObjectHandle *)local_58);
    if ((bool)dict_updates.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_) {
      QPDFObjectHandle::copyStream();
      pmVar4 = std::
               map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
               ::operator[](&this->copied_streams,&local_28);
      this_00 = &dict.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      QPDFObjectHandle::operator=(pmVar4,(QPDFObjectHandle *)this_00);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)this_00);
      QPDFObjectHandle::getDict();
      QPDFObjectHandle::getKeys_abi_cxx11_();
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin2);
      k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin2);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&k), bVar1) {
        pbVar5 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
        QPDFObjectHandle::getKey((string *)local_130);
        QPDFObjectHandle::replaceKey((string *)&__range2,(QPDFObjectHandle *)pbVar5);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_130);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin2);
      pmVar6 = std::
               map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
               ::operator[](&this->keys,&local_28);
      p_str.field_2._M_local_buf[0xf] = *pmVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_158,p_str.field_2._M_local_buf + 0xf,1,
                 (allocator *)
                 ((long)&dp_stream.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&dp_stream.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDF::newStream((string *)
                      &decode_parms.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      local_1f8 = &local_1f0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
      ::pair<const_char_(&)[11],_QPDFObjectHandle_&,_true>
                (local_1f8,(char (*) [11])"/KeyStream",
                 (QPDFObjectHandle *)
                 &decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      local_1c0 = &local_1f0;
      local_1b8 = 1;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::allocator(&local_1fa);
      __l._M_len = local_1b8;
      __l._M_array = local_1c0;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::map(&local_1b0,__l,&local_1f9,&local_1fa);
      QPDFObjectHandle::newDictionary((map *)local_180);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~map(&local_1b0);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::~allocator(&local_1fa);
      local_300 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                   *)&local_1c0;
      do {
        local_300 = local_300 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
        ::~pair(local_300);
      } while (local_300 != &local_1f0);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr(&local_210,self);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_240,"/XORDecode",
                 (allocator<char> *)
                 ((long)&protect.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::newName((string *)&local_220);
      QPDFObjectHandle::replaceStreamData(stream,&local_210,&local_220,local_180);
      QPDFObjectHandle::~QPDFObjectHandle(&local_220);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&protect.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_210);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_278,"/ProtectXOR",&local_279);
      QPDFObjectHandle::getKey((string *)local_258);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator(&local_279);
      bVar2 = QPDFObjectHandle::isBool();
      if (((bVar2 & 1) != 0) && (bVar2 = QPDFObjectHandle::getBoolValue(), (bVar2 & 1) != 0)) {
        QPDFObjectHandle::setFilterOnWrite(SUB81(stream,0));
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_258);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_180);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string(local_158);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range2);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  }
  return;
}

Assistant:

void
StreamReplacer::registerStream(
    QPDFObjectHandle stream, std::shared_ptr<QPDFObjectHandle::StreamDataProvider> self)
{
    QPDFObjGen og(stream.getObjGen());

    // We don't need to process a stream more than once. In this example, we are just iterating
    // through objects, but if we were doing something like iterating through images on pages, we
    // might realistically encounter the same stream more than once.
    if (this->copied_streams.count(og) > 0) {
        return;
    }
    // Store something in copied_streams so that we don't double-process even in the negative case.
    // This gets replaced later if needed.
    this->copied_streams[og] = QPDFObjectHandle::newNull();

    // Call maybeReplace with dict_updates. In this mode, it determines whether we should replace
    // the stream data and, if so, supplies dictionary updates we should make.
    bool should_replace = false;
    QPDFObjectHandle dict_updates = QPDFObjectHandle::newDictionary();
    try {
        should_replace = maybeReplace(og, stream, nullptr, &dict_updates);
    } catch (std::exception& e) {
        stream.warnIfPossible(std::string("exception while attempting to replace: ") + e.what());
    }

    if (should_replace) {
        // Copy the stream so we can get to the original data from the stream data provider. This
        // doesn't actually copy any data, but the copy retains the original stream data after the
        // original one is modified.
        this->copied_streams[og] = stream.copyStream();
        // Update the stream dictionary with any changes.
        auto dict = stream.getDict();
        for (auto const& k: dict_updates.getKeys()) {
            dict.replaceKey(k, dict_updates.getKey(k));
        }
        // Create the key stream that will be referenced from /DecodeParms. We have to do this now
        // since you can't modify or create objects during write.
        char p[1] = {static_cast<char>(this->keys[og])};
        std::string p_str(p, 1);
        QPDFObjectHandle dp_stream = this->pdf->newStream(p_str);
        // Create /DecodeParms as expected by our fictitious /XORDecode filter.
        QPDFObjectHandle decode_parms =
            QPDFObjectHandle::newDictionary({{"/KeyStream", dp_stream}});
        stream.replaceStreamData(self, QPDFObjectHandle::newName("/XORDecode"), decode_parms);
        // Further, if /ProtectXOR = true, we disable filtering on write so that QPDFWriter will not
        // decode the stream even though we have registered a stream filter for /XORDecode.
        auto protect = dict.getKey("/ProtectXOR");
        if (protect.isBool() && protect.getBoolValue()) {
            stream.setFilterOnWrite(false);
        }
    }
}